

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int runtest(int i)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *filename;
  int *piVar9;
  char *pcVar10;
  ulong uVar11;
  char *__format;
  glob64_t local_78;
  
  iVar3 = nb_tests;
  iVar2 = nb_leaks;
  iVar1 = nb_errors;
  if ((tests_quiet == '\0') && (testDescriptions[i].desc != (char *)0x0)) {
    printf("## %s\n");
  }
  lVar6 = xmlGetCharEncodingHandler(6);
  lVar7 = xmlGetCharEncodingHandler(0x15);
  if (testDescriptions[i].in == (char *)0x0) {
    testErrorsSize = 0;
    testErrors[0] = '\0';
    extraMemoryFromResolver = 0;
    iVar4 = (*testDescriptions[i].func)
                      ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[i].options);
    if (iVar4 != 0) {
      nb_errors = nb_errors + 1;
    }
  }
  else {
    local_78.gl_offs = 0;
    glob64(testDescriptions[i].in,8,(__errfunc *)0x0,&local_78);
    for (uVar11 = 0; uVar11 < local_78.gl_pathc; uVar11 = uVar11 + 1) {
      iVar4 = checkTestFile(local_78.gl_pathv[uVar11]);
      if (((iVar4 != 0) &&
          ((lVar6 != 0 ||
           (pcVar8 = strstr(local_78.gl_pathv[uVar11],"ebcdic"), pcVar8 == (char *)0x0)))) &&
         ((lVar7 != 0 ||
          (pcVar8 = strstr(local_78.gl_pathv[uVar11],"icu_parse_test"), pcVar8 == (char *)0x0)))) {
        if (testDescriptions[i].suffix == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = resultFilename(local_78.gl_pathv[uVar11],testDescriptions[i].out,
                                  testDescriptions[i].suffix);
          if (pcVar8 == (char *)0x0) goto LAB_00105f77;
        }
        if (testDescriptions[i].err == (char *)0x0) {
          filename = (char *)0x0;
        }
        else {
          filename = resultFilename(local_78.gl_pathv[uVar11],testDescriptions[i].out,
                                    testDescriptions[i].err);
          if (filename == (char *)0x0) {
LAB_00105f77:
            fwrite("Out of memory !\n",0x10,1,_stderr);
            fatalError();
          }
        }
        if (((pcVar8 == (char *)0x0) || (iVar4 = checkTestFile(pcVar8), iVar4 != 0)) ||
           ((update_results & 1) != 0)) {
          if (((filename != (char *)0x0) && (iVar4 = checkTestFile(filename), iVar4 == 0)) &&
             ((update_results & 1) == 0)) {
            __format = "Missing error file %s\n";
            pcVar10 = filename;
            goto LAB_00105eb9;
          }
          iVar4 = xmlMemUsed();
          extraMemoryFromResolver = 0;
          testErrorsSize = 0;
          testErrors[0] = '\0';
          iVar5 = (*testDescriptions[i].func)
                            (local_78.gl_pathv[uVar11],pcVar8,filename,
                             testDescriptions[i].options | 0x10000);
          xmlResetLastError();
          if (iVar5 == 0) {
            iVar5 = xmlMemUsed();
            if (((iVar5 != iVar4) && (iVar5 = xmlMemUsed(), __stream = _stderr, iVar5 != iVar4)) &&
               (extraMemoryFromResolver == 0)) {
              pcVar10 = local_78.gl_pathv[uVar11];
              iVar5 = xmlMemUsed();
              fprintf(__stream,"File %s leaked %d bytes\n",pcVar10,(ulong)(uint)(iVar5 - iVar4));
              piVar9 = &nb_leaks;
              goto LAB_00105e65;
            }
          }
          else {
            fprintf(_stderr,"File %s generated an error\n",local_78.gl_pathv[uVar11]);
            piVar9 = &nb_errors;
LAB_00105e65:
            *piVar9 = *piVar9 + 1;
          }
          testErrorsSize = 0;
        }
        else {
          __format = "Missing result file %s\n";
          pcVar10 = pcVar8;
LAB_00105eb9:
          fprintf(_stderr,__format,pcVar10);
        }
        free(pcVar8);
        free(filename);
      }
    }
    globfree64(&local_78);
  }
  xmlCharEncCloseFunc(lVar6);
  iVar4 = xmlCharEncCloseFunc(lVar7);
  if (verbose == '\x01') {
    if (nb_leaks == iVar2 && nb_errors == iVar1) {
      iVar4 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
    }
    else {
      iVar4 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
                     (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)(nb_leaks - iVar2));
    }
  }
  return iVar4;
}

Assistant:

static int
runtest(int i) {
    int ret = 0, res;
    int old_errors, old_tests, old_leaks;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    if ((tests_quiet == 0) && (testDescriptions[i].desc != NULL))
	printf("## %s\n", testDescriptions[i].desc);
    res = launchTests(&testDescriptions[i]);
    if (res != 0)
	ret++;
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}